

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage
          (FileGenerator *this,int idx,Printer *p)

{
  Descriptor *this_00;
  Printer *pPVar1;
  bool bVar2;
  FieldDescriptor *pFVar3;
  Options *in_RCX;
  Options *options;
  char *pcVar4;
  int i;
  int iVar5;
  undefined8 uVar6;
  FileGenerator *this_01;
  long lVar7;
  Printer *p_local;
  int idx_local;
  allocator<char> local_28a;
  allocator<char> local_289;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278 [8];
  undefined8 uStack_270;
  Printer *local_268;
  undefined8 local_260;
  Printer local_258 [8];
  pointer pbStack_250;
  _Any_data local_248;
  code *local_238;
  code *pcStack_230;
  Printer *local_228;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
  v;
  NamespaceOpener proto_ns;
  char local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [8];
  undefined8 uStack_140;
  variant<std::__cxx11::string,std::function<bool()>> local_138 [32];
  char local_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100 [16];
  undefined1 local_f0;
  undefined1 local_a8;
  NamespaceOpener ns;
  CrossFileReferences refs;
  
  p_local = p;
  idx_local = idx;
  (anonymous_namespace)::FileVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&proto_ns,(_anonymous_namespace_ *)this->file_,(FileDescriptor *)&this->options_,
             in_RCX);
  io::Printer::
  WithVars<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>
            (&v,p,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&proto_ns);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&proto_ns);
  this_01 = this;
  GenerateSourceIncludes(this,p_local);
  GenerateSourcePrelude(this_01,p_local);
  bVar2 = IsAnyMessage(this->file_);
  if (bVar2) {
    anon_unknown_22::MuteWuninitialized(p_local);
  }
  options = (Options *)&refs;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  refs.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  refs.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  refs.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  this_00 = *(Descriptor **)
             (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[idx_local]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ._M_t;
  proto_ns.p_ = (Printer *)this;
  proto_ns._8_8_ = options;
  for (iVar5 = 0; iVar5 < *(int *)(this_00 + 0x8c); iVar5 = iVar5 + 1) {
    pFVar3 = Descriptor::extension(this_00,iVar5);
    GenerateSourceForMessage::anon_class_16_2_3fe543fb::operator()
              ((anon_class_16_2_3fe543fb *)&proto_ns,pFVar3);
  }
  for (iVar5 = 0; iVar5 < *(int *)(this_00 + 4); iVar5 = iVar5 + 1) {
    pFVar3 = Descriptor::field(this_00,iVar5);
    GenerateSourceForMessage::anon_class_16_2_3fe543fb::operator()
              ((anon_class_16_2_3fe543fb *)&proto_ns,pFVar3);
  }
  GenerateInternalForwardDeclarations(this,&refs,p_local);
  Namespace_abi_cxx11_
            ((string *)&proto_ns,(cpp *)this->file_,(FileDescriptor *)&this->options_,options);
  NamespaceOpener::NamespaceOpener(&ns,proto_ns._8_8_,proto_ns.p_,p_local);
  std::__cxx11::string::~string((string *)&proto_ns);
  pPVar1 = p_local;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"defaults",&local_289);
  proto_ns.p_ = (Printer *)&proto_ns.name_stack_;
  if (local_268 == local_258) {
    proto_ns.name_stack_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbStack_250;
  }
  else {
    proto_ns.p_ = local_268;
  }
  local_228 = pPVar1;
  proto_ns._8_8_ = local_260;
  local_260 = 0;
  local_258[0] = (Printer)0x0;
  local_238 = (code *)0x0;
  pcStack_230 = (code *)0x0;
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_268 = local_258;
  local_248._M_unused._M_object = operator_new(0x20);
  *(FileGenerator **)local_248._M_unused._0_8_ = this;
  *(int **)((long)local_248._M_unused._0_8_ + 8) = &idx_local;
  *(Printer ***)((long)local_248._M_unused._0_8_ + 0x10) = &p_local;
  *(code *)((long)local_248._M_unused._0_8_ + 0x18) = (code)0x0;
  pcStack_230 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_238 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)
             &proto_ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(function<bool_()> *)&local_248);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  local_1c8 = local_1b8;
  local_1c0 = 0;
  local_1b8[0] = 0;
  local_1a8 = 0;
  if (local_1d0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_1c8);
  }
  local_160 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"class_methods",&local_28a);
  local_158 = local_148;
  if (local_288 == local_278) {
    uStack_140 = uStack_270;
  }
  else {
    local_158 = local_288;
  }
  local_150 = local_280;
  local_280 = 0;
  local_278[0] = 0;
  local_238 = (code *)0x0;
  pcStack_230 = (code *)0x0;
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_288 = local_278;
  local_248._M_unused._M_object = operator_new(0x20);
  *(FileGenerator **)local_248._M_unused._0_8_ = this;
  *(int **)((long)local_248._M_unused._0_8_ + 8) = &idx_local;
  *(Printer ***)((long)local_248._M_unused._0_8_ + 0x10) = &p_local;
  *(code *)((long)local_248._M_unused._0_8_ + 0x18) = (code)0x0;
  pcStack_230 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_238 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_138,(function<bool_()> *)&local_248);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  local_110 = local_100;
  local_108 = 0;
  local_100[0] = 0;
  local_f0 = 0;
  if (local_118 == '\x01') {
    std::__cxx11::string::assign((char *)&local_110);
  }
  local_a8 = 0;
  google::protobuf::io::Printer::Emit
            (local_228,&proto_ns,2,0x73,
             "\n          $defaults$;\n\n          $class_methods$;\n\n          // @@protoc_insertion_point(namespace_scope)\n        "
            );
  lVar7 = 0xb8;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&proto_ns.p_ + lVar7));
    lVar7 = lVar7 + -0xb8;
  } while (lVar7 != -0xb8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  NamespaceOpener::~NamespaceOpener(&ns);
  bVar2 = (this->options_).opensource_runtime != false;
  uVar6 = 6;
  if (bVar2) {
    uVar6 = 0x10;
  }
  pcVar4 = "proto2";
  if (bVar2) {
    pcVar4 = "google::protobuf";
  }
  NamespaceOpener::NamespaceOpener(&proto_ns,uVar6,pcVar4,p_local);
  MessageGenerator::GenerateSourceInProto2Namespace
            ((MessageGenerator *)
             (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[idx_local]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ._M_t,p_local);
  NamespaceOpener::~NamespaceOpener(&proto_ns);
  bVar2 = IsAnyMessage(this->file_);
  if (bVar2) {
    anon_unknown_22::UnmuteWuninitialized(p_local);
  }
  io::Printer::Emit(p_local,0x31,"\n    // @@protoc_insertion_point(global_scope)\n  ");
  CrossFileReferences::~CrossFileReferences(&refs);
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1039:28)>
  ::~Cleanup(&v);
  return;
}

Assistant:

void FileGenerator::GenerateSourceForMessage(int idx, io::Printer* p) {
  auto v = p->WithVars(FileVars(file_, options_));

  GenerateSourceIncludes(p);
  GenerateSourcePrelude(p);

  if (IsAnyMessage(file_)) {
    MuteWuninitialized(p);
  }

  CrossFileReferences refs;
  ForEachField<false>(message_generators_[idx]->descriptor(),
                      [this, &refs](const FieldDescriptor* field) {
                        GetCrossFileReferencesForField(field, &refs);
                      });

  GenerateInternalForwardDeclarations(refs, p);

  {
    NamespaceOpener ns(Namespace(file_, options_), p);
    p->Emit(
        {
            {"defaults", [&] { GenerateSourceDefaultInstance(idx, p); }},
            {"class_methods",
             [&] { message_generators_[idx]->GenerateClassMethods(p); }},
        },
        R"cc(
          $defaults$;

          $class_methods$;

          // @@protoc_insertion_point(namespace_scope)
        )cc");
  }

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), p);
    message_generators_[idx]->GenerateSourceInProto2Namespace(p);
  }

  if (IsAnyMessage(file_)) {
    UnmuteWuninitialized(p);
  }

  p->Emit(R"cc(
    // @@protoc_insertion_point(global_scope)
  )cc");
}